

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockIndex.h
# Opt level: O2

void __thiscall
adios2::query::BlockIndex<long>::RunStatBlocksInfo
          (BlockIndex<long> *this,QueryVar *query,size_t currStep,
          vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> *hitBlocks)

{
  Dims *start;
  Dims *count;
  pointer plVar1;
  pointer plVar2;
  pointer plVar3;
  pointer puVar4;
  pointer puVar5;
  BlockHit *pBVar6;
  bool bVar7;
  bool bVar8;
  ulong uVar9;
  long lVar10;
  pointer pBVar11;
  ulong uVar12;
  BlockHit tmp;
  Box<adios2::Dims> box;
  vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
  varBlocksInfo;
  BlockHit local_b8;
  Box<Dims> local_98;
  vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
  local_68;
  BlockHit local_50;
  
  core::Engine::BlocksInfo<long>(&local_68,this->m_IdxReader,this->m_VarPtr,currStep);
  pBVar11 = local_68.
            super__Vector_base<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
            ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pBVar11 ==
        local_68.
        super__Vector_base<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
      ::~vector(&local_68);
      return;
    }
    bVar7 = RangeTree::CheckInterval<long>(&query->m_RangeTree,&pBVar11->Min,&pBVar11->Max);
    if (bVar7) {
      if ((this->m_VarPtr->super_VariableBase).m_ShapeID == LocalArray) {
        BlockHit::BlockHit((BlockHit *)&local_98,pBVar11->BlockID);
        std::vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>::
        emplace_back<adios2::query::BlockHit>(hitBlocks,(BlockHit *)&local_98);
        pBVar6 = (BlockHit *)&local_98;
      }
      else {
        start = &pBVar11->Start;
        count = &pBVar11->Count;
        bVar7 = QueryVar::TouchSelection(query,start,count);
        if (!bVar7) goto LAB_005ed845;
        BlockHit::BlockHit(&local_b8,pBVar11->BlockID);
        if ((pBVar11->MinMaxs).super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            (pBVar11->MinMaxs).super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_start) {
LAB_005ed7df:
          std::
          pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::
          pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&,_true>
                    (&local_98,start,count);
          BlockHit::BlockHit(&local_50,pBVar11->BlockID,&local_98);
          std::vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>::
          emplace_back<adios2::query::BlockHit>(hitBlocks,&local_50);
          std::
          vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
          ::~vector(&local_50.m_Regions);
          std::
          pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::~pair(&local_98);
        }
        else {
          helper::CalculateSubblockInfo(count,&pBVar11->SubBlockInfo);
          plVar1 = (pBVar11->MinMaxs).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          plVar2 = (pBVar11->MinMaxs).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          bVar7 = true;
          for (uVar12 = 0; uVar12 != ((ulong)((long)plVar1 - (long)plVar2) >> 4 & 0xffffffff);
              uVar12 = uVar12 + 1) {
            uVar9 = (ulong)((uint)uVar12 * 2);
            plVar3 = (pBVar11->MinMaxs).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            bVar8 = RangeTree::CheckInterval<long>
                              (&query->m_RangeTree,plVar3 + uVar9,plVar3 + uVar9 + 1);
            if (bVar8) {
              helper::GetSubBlock(&local_98,count,&pBVar11->SubBlockInfo,(uint)uVar12);
              puVar4 = (pBVar11->Count).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              puVar5 = (pBVar11->Count).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start;
              for (lVar10 = 0; (long)puVar4 - (long)puVar5 >> 3 != lVar10; lVar10 = lVar10 + 1) {
                local_98.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start[lVar10] =
                     local_98.first.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar10] +
                     (start->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_start[lVar10];
              }
              bVar8 = QueryVar::TouchSelection
                                (query,&local_98.first,(Dims *)((long)&local_98 + 0x18));
              if (bVar8) {
                std::
                vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                ::push_back(&local_b8.m_Regions,&local_98);
              }
              std::
              pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              ::~pair(&local_98);
            }
            else {
              bVar7 = false;
            }
          }
          if (bVar7) goto LAB_005ed7df;
          std::vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>::push_back
                    (hitBlocks,&local_b8);
        }
        pBVar6 = &local_b8;
      }
      std::
      vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
      ::~vector(&pBVar6->m_Regions);
    }
LAB_005ed845:
    pBVar11 = pBVar11 + 1;
  } while( true );
}

Assistant:

void RunStatBlocksInfo(const QueryVar &query, const size_t currStep,
                           std::vector<BlockHit> &hitBlocks)
    {
        std::vector<typename adios2::core::Variable<T>::BPInfo> varBlocksInfo =
            m_IdxReader.BlocksInfo(*m_VarPtr, currStep);

        for (auto &blockInfo : varBlocksInfo)
        {
            bool isHit = query.m_RangeTree.CheckInterval(blockInfo.Min, blockInfo.Max);
            if (!isHit)
                continue;

            if (m_VarPtr->m_ShapeID == adios2::ShapeID::LocalArray)
            {
                if (isHit)
                    hitBlocks.push_back(BlockHit(blockInfo.BlockID));
            }
            else
            {
                // global array
                if (!query.TouchSelection(blockInfo.Start, blockInfo.Count))
                    continue;

                BlockHit tmp(blockInfo.BlockID);
                if (blockInfo.MinMaxs.size() > 0)
                {
                    // Consolidate to whole block If all subblocks are hits, then return the whole
                    // block
                    bool allCovered = true;

                    adios2::helper::CalculateSubblockInfo(blockInfo.Count, blockInfo.SubBlockInfo);
                    unsigned int numSubBlocks =
                        static_cast<unsigned int>(blockInfo.MinMaxs.size() / 2);
                    for (unsigned int i = 0; i < numSubBlocks; i++)
                    {
                        bool isSubblockHit = query.m_RangeTree.CheckInterval(
                            blockInfo.MinMaxs[2 * i], blockInfo.MinMaxs[2 * i + 1]);
                        if (isSubblockHit)
                        {
                            adios2::Box<adios2::Dims> currSubBlock = adios2::helper::GetSubBlock(
                                blockInfo.Count, blockInfo.SubBlockInfo, i);
                            for (size_t d = 0; d < blockInfo.Count.size(); ++d)
                                currSubBlock.first[d] += blockInfo.Start[d];

                            if (!query.TouchSelection(currSubBlock.first, currSubBlock.second))
                                continue;
                            tmp.m_Regions.push_back(currSubBlock);
                        }
                        else
                        {
                            allCovered = false;
                        }
                    } // for num subblocks

                    if (!allCovered)
                    {
                        hitBlocks.push_back(tmp);
                        continue;
                    }
                }

                // no subblock info or (allCovered = true)
                adios2::Box<adios2::Dims> box = {blockInfo.Start, blockInfo.Count};
                hitBlocks.push_back(BlockHit(blockInfo.BlockID, box));
            }
        }
    }